

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

bool image_match::check_magic_number(path *filepath)

{
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  source_loc loc_03;
  int iVar1;
  logger *plVar2;
  long *plVar3;
  bool bVar4;
  undefined1 local_2c0 [32];
  uint8_t buff [8];
  undefined4 uStack_284;
  undefined4 uStack_26c;
  undefined4 uStack_254;
  undefined4 uStack_23c;
  ifstream input_file;
  byte abStack_210 [488];
  
  plVar2 = spdlog::default_logger_raw();
  CLI::std::filesystem::__cxx11::path::string((string *)&input_file,(path *)filepath);
  local_2c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
  ;
  local_2c0._8_4_ = 0x76;
  local_2c0._16_8_ = "check_magic_number";
  buff = (uint8_t  [8])anon_var_dwarf_15528e;
  loc._12_4_ = local_2c0._12_4_;
  loc.line = 0x76;
  loc.filename = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
  ;
  loc.funcname = "check_magic_number";
  spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
            (plVar2,loc,debug,(basic_string_view<char> *)buff,(string *)&input_file);
  std::__cxx11::string::~string((string *)&input_file);
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ifstream *)&input_file,(path *)filepath,_S_bin);
  if ((abStack_210[*(long *)(_input_file + -0x18)] & 5) == 0) {
    plVar3 = (long *)std::istream::read((char *)&input_file,(long)buff);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      CLI::std::filesystem::__cxx11::path::string((string *)local_2c0,(path *)filepath);
      spdlog::warn<char[40],std::__cxx11::string>
                ((char (*) [40])"Could not read magic number for file {}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
      goto LAB_00148a4f;
    }
    if (buff[0] == 'B') {
      plVar2 = spdlog::default_logger_raw();
      loc_02._12_4_ = uStack_26c;
      loc_02.line = 0x94;
      loc_02.filename =
           "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
      ;
      loc_02.funcname = "check_magic_number";
      spdlog::logger::log<char[24],_0>(plVar2,loc_02,debug,(char (*) [24])"Found BMP magic number.")
      ;
      bVar4 = buff[1] == 'M';
      goto LAB_00148a5b;
    }
    if (buff[0] == 0x89) {
      plVar2 = spdlog::default_logger_raw();
      loc_01._12_4_ = uStack_254;
      loc_01.line = 0x8d;
      loc_01.filename =
           "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
      ;
      loc_01.funcname = "check_magic_number";
      spdlog::logger::log<char[24],_0>(plVar2,loc_01,debug,(char (*) [24])"Found PNG magic number.")
      ;
      bVar4 = buff == (uint8_t  [8])0xa1a0a0d474e5089;
      goto LAB_00148a5b;
    }
    if (buff[0] == 0xff) {
      plVar2 = spdlog::default_logger_raw();
      loc_00._12_4_ = uStack_23c;
      loc_00.line = 0x88;
      loc_00.filename =
           "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
      ;
      loc_00.funcname = "check_magic_number";
      spdlog::logger::log<char[25],_0>
                (plVar2,loc_00,debug,(char (*) [25])"Found JPEG magic number.");
      iVar1 = bcmp(buff,anon_var_dwarf_1552e6,3);
      bVar4 = iVar1 == 0;
      goto LAB_00148a5b;
    }
    plVar2 = spdlog::default_logger_raw();
    loc_03._12_4_ = uStack_284;
    loc_03.line = 0x98;
    loc_03.filename =
         "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
    ;
    loc_03.funcname = "check_magic_number";
    spdlog::logger::log<char[37],_0>
              (plVar2,loc_03,debug,(char (*) [37])"Magic number unsupported or invalid.");
  }
  else {
    CLI::std::filesystem::__cxx11::path::string((string *)local_2c0,(path *)filepath);
    spdlog::warn<char[23],std::__cxx11::string>
              ((char (*) [23])"Could not open file {}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
LAB_00148a4f:
    std::__cxx11::string::~string((string *)local_2c0);
  }
  bVar4 = false;
LAB_00148a5b:
  std::ifstream::~ifstream(&input_file);
  return bVar4;
}

Assistant:

bool
check_magic_number(const std::filesystem::path& filepath)
{
    SPDLOG_DEBUG("Checking magic number for {}", filepath.string());

    std::ifstream input_file(filepath, std::ios_base::binary);
    if (!input_file) {
        spdlog::warn("Could not open file {}", filepath.string());
        return false;
    }

    std::uint8_t buff[MAGIC_NUMBER_BYTES];
    if (!input_file.read(reinterpret_cast<char*>(buff), sizeof(buff))) {
        spdlog::warn("Could not read magic number for file {}",
                     filepath.string());
        return false;
    }

    // Compare magic number
    switch (buff[0]) {
        case static_cast<std::uint8_t>('\xFF'):
            SPDLOG_DEBUG("Found JPEG magic number.");
            return (!strncmp((const char*)buff, "\xFF\xD8\xFF", 3)) ? true
                                                                    : false;

        case static_cast<std::uint8_t>('\x89'):
            SPDLOG_DEBUG("Found PNG magic number.");
            return (!strncmp(
                     (const char*)buff, "\x89\x50\x4E\x47\x0D\x0A\x1A\x0A", 8))
                     ? true
                     : false;

        case 'B':
            SPDLOG_DEBUG("Found BMP magic number.");
            return ((buff[1] == 'M')) ? true : false;
    }

    SPDLOG_DEBUG("Magic number unsupported or invalid.");

    return false;
}